

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  string *psVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  LogMessage *pLVar6;
  SourceCodeInfo *pSVar7;
  void *pvVar8;
  byte bVar9;
  LocationRecorder *unaff_RBP;
  Arena *pAVar10;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogFinisher local_b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  LocationRecorder local_b0;
  LogMessage local_98;
  SourceCodeInfo local_60;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_60);
  this->source_code_info_ = &local_60;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_b0,this);
  LocationRecorder::RecordLegacyLocation(&local_b0,&file->super_Message,OTHER);
  if (this->require_syntax_identifier_ == false) {
    iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar5 == 0) goto LAB_0030d3c1;
    if (this->stop_after_syntax_identifier_ == false) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
                 ,0x286);
      pLVar6 = internal::LogMessage::operator<<
                         (&local_98,"No syntax specified for the proto file: ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,(file->name_).ptr_);
      pLVar6 = internal::LogMessage::operator<<(pLVar6,". Please use \'syntax = \"proto2\";\' ");
      pLVar6 = internal::LogMessage::operator<<
                         (pLVar6,"or \'syntax = \"proto3\";\' to specify a syntax ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,"version. (Defaulted to proto2 syntax.)");
      internal::LogFinisher::operator=(&local_b9,pLVar6);
      internal::LogMessage::~LogMessage(&local_98);
      std::__cxx11::string::_M_replace
                ((ulong)&this->syntax_identifier_,0,
                 (char *)(this->syntax_identifier_)._M_string_length,0x3a55df);
    }
LAB_0030d416:
    if (this->stop_after_syntax_identifier_ == false) {
      bVar3 = true;
      if ((this->input_->current_).type != TYPE_END) {
        local_b8 = &this->upcoming_detached_comments_;
        unaff_RBP = &local_b0;
        do {
          bVar4 = ParseTopLevelStatement(this,file,unaff_RBP);
          if (!bVar4) {
            SkipStatement(this);
            iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar5 == 0) {
              local_98._0_8_ = (long)&local_98 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,"Unmatched \"}\".","");
              pEVar2 = this->error_collector_;
              if (pEVar2 != (ErrorCollector *)0x0) {
                (*pEVar2->_vptr_ErrorCollector[2])
                          (pEVar2,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,&local_98);
              }
              this->had_errors_ = true;
              if (local_98._0_8_ != (long)&local_98 + 0x10U) {
                operator_delete((void *)local_98._0_8_);
              }
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,local_b8,&this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      goto LAB_0030d4fa;
    }
    unaff_RBP = (LocationRecorder *)(ulong)(this->had_errors_ ^ 1);
  }
  else {
LAB_0030d3c1:
    bVar3 = ParseSyntaxIdentifier(this,&local_b0);
    if (bVar3) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 4;
        pAVar10 = (Arena *)(file->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
        if (((ulong)pAVar10 & 1) != 0) {
          pAVar10 = *(Arena **)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x18);
        }
        psVar1 = (file->syntax_).ptr_;
        if (psVar1 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance(&file->syntax_,pAVar10,&this->syntax_identifier_)
          ;
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar1);
        }
      }
      goto LAB_0030d416;
    }
    unaff_RBP = (LocationRecorder *)0x0;
  }
  bVar3 = false;
LAB_0030d4fa:
  bVar9 = (byte)unaff_RBP;
  LocationRecorder::~LocationRecorder(&local_b0);
  if (bVar3) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 0x10;
    if (file->source_code_info_ == (SourceCodeInfo *)0x0) {
      pAVar10 = (Arena *)(file->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x18);
      }
      pSVar7 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo>(pAVar10);
      file->source_code_info_ = pSVar7;
    }
    pSVar7 = file->source_code_info_;
    if (pSVar7 != &local_60) {
      if (((ulong)local_60._internal_metadata_.
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_ & 1) != 0) {
        local_60._internal_metadata_.
        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
        .ptr_ = *(InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  *)(((ulong)local_60._internal_metadata_.
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             .ptr_ & 0xfffffffffffffffe) + 0x18);
      }
      pvVar8 = (pSVar7->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar8 & 1) != 0) {
        pvVar8 = *(void **)(((ulong)pvVar8 & 0xfffffffffffffffe) + 0x18);
      }
      if (local_60._internal_metadata_.
          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
          .ptr_ == (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    )pvVar8) {
        SourceCodeInfo::InternalSwap(&local_60,pSVar7);
      }
      else {
        internal::GenericSwap((MessageLite *)&local_60,(MessageLite *)pSVar7);
      }
    }
    bVar9 = this->had_errors_ ^ 1;
  }
  SourceCodeInfo::~SourceCodeInfo(&local_60);
  return (bool)(bVar9 & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: " << file->name()
                   << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}